

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::KNearestNeighborsClassifier::_InternalParse
          (KNearestNeighborsClassifier *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *this_00;
  bool bVar1;
  uint uVar2;
  NearestNeighborsIndex *msg;
  Int64Parameter *msg_00;
  StringVector *msg_01;
  Int64Vector *msg_02;
  string *s;
  uint64_t value;
  UniformWeighting *msg_03;
  InverseDistanceWeighting *msg_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  string *str;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  KNearestNeighborsClassifier *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&str + 4),0);
    this_00 = pPStack_20;
    tag_00 = str._4_4_;
    uVar2 = str._4_4_ >> 3;
    if (uVar2 == 1) {
      if ((str._4_4_ & 0xff) != 10) goto LAB_002b9d3d;
      msg = _internal_mutable_nearestneighborsindex(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (this_00,&msg->super_MessageLite,(char *)ctx_local);
    }
    else if (uVar2 == 3) {
      if ((str._4_4_ & 0xff) != 0x1a) goto LAB_002b9d3d;
      msg_00 = _internal_mutable_numberofneighbors(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (this_00,&msg_00->super_MessageLite,(char *)ctx_local);
    }
    else if (uVar2 == 100) {
      if ((str._4_4_ & 0xff) != 0x22) goto LAB_002b9d3d;
      msg_01 = _internal_mutable_stringclasslabels(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (this_00,&msg_01->super_MessageLite,(char *)ctx_local);
    }
    else if (uVar2 == 0x65) {
      if ((str._4_4_ & 0xff) != 0x2a) goto LAB_002b9d3d;
      msg_02 = _internal_mutable_int64classlabels(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (this_00,&msg_02->super_MessageLite,(char *)ctx_local);
    }
    else if (uVar2 == 0x6e) {
      if ((str._4_4_ & 0xff) != 0x72) goto LAB_002b9d3d;
      s = _internal_mutable_defaultstringlabel_abi_cxx11_(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::InlineGreedyStringParser
                            (s,(char *)ctx_local,pPStack_20);
      bVar1 = google::protobuf::internal::VerifyUTF8(s,(char *)0x0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return (char *)0x0;
      }
    }
    else if (uVar2 == 0x6f) {
      if ((str._4_4_ & 0xff) != 0x78) goto LAB_002b9d3d;
      value = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
      _internal_set_defaultint64label(this,value);
    }
    else if (uVar2 == 200) {
      if ((str._4_4_ & 0xff) != 0x42) goto LAB_002b9d3d;
      msg_03 = _internal_mutable_uniformweighting(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (this_00,&msg_03->super_MessageLite,(char *)ctx_local);
    }
    else if ((uVar2 == 0xd2) && ((str._4_4_ & 0xff) == 0x92)) {
      msg_04 = _internal_mutable_inversedistanceweighting(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (this_00,&msg_04->super_MessageLite,(char *)ctx_local);
    }
    else {
LAB_002b9d3d:
      if ((str._4_4_ == 0) || ((str._4_4_ & 7) == 4)) {
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        google::protobuf::internal::EpsCopyInputStream::SetLastTag
                  (&pPStack_20->super_EpsCopyInputStream,str._4_4_);
        return (char *)ctx_local;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::UnknownFieldParse
                            (tag_00,unknown,(char *)ctx_local,pPStack_20);
    }
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* KNearestNeighborsClassifier::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.NearestNeighborsIndex nearestNeighborsIndex = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_nearestneighborsindex(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Parameter numberOfNeighbors = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_numberofneighbors(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringclasslabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64classlabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string defaultStringLabel = 110;
      case 110:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 114)) {
          auto str = _internal_mutable_defaultstringlabel();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int64 defaultInt64Label = 111;
      case 111:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 120)) {
          _internal_set_defaultint64label(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.UniformWeighting uniformWeighting = 200;
      case 200:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_uniformweighting(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.InverseDistanceWeighting inverseDistanceWeighting = 210;
      case 210:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 146)) {
          ptr = ctx->ParseMessage(_internal_mutable_inversedistanceweighting(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}